

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O1

wchar_t archive_match_exclude_entry(archive *_a,wchar_t flag,archive_entry *entry)

{
  size_t *rbt;
  int iVar1;
  wchar_t wVar2;
  archive_string_conv *self;
  char *pcVar3;
  size_t sVar4;
  _func_wchar_t_archive_string_ptr_void_ptr_size_t_archive_string_conv_ptr *p_Var5;
  long lVar6;
  archive_rb_node *paVar7;
  
  iVar1 = __archive_check_magic(_a,0xcad11c9,1,"archive_match_time_include_entry");
  if (iVar1 == -0x1e) {
    return L'\xffffffe2';
  }
  if (entry == (archive_entry *)0x0) {
    pcVar3 = "entry is NULL";
  }
  else {
    wVar2 = validate_time_flag(_a,flag,"archive_match_exclude_entry");
    if (wVar2 != L'\0') {
      return wVar2;
    }
    self = (archive_string_conv *)calloc(1,0xb0);
    if (self == (archive_string_conv *)0x0) {
      archive_set_error(_a,0xc,"No memory");
      _a->state = 0x8000;
      return L'\xffffffe2';
    }
    pcVar3 = archive_entry_pathname(entry);
    if (pcVar3 != (char *)0x0) {
      archive_mstring_copy_mbs((archive_mstring *)&self->same,pcVar3);
      rbt = &_a[2].error_string.buffer_length;
      _a[2].current_code = (char *)&rb_ops_mbs;
      *(wchar_t *)&self[1].utftmp.length = flag;
      sVar4 = archive_entry_mtime(entry);
      self[1].utftmp.buffer_length = sVar4;
      p_Var5 = (_func_wchar_t_archive_string_ptr_void_ptr_size_t_archive_string_conv_ptr *)
               archive_entry_mtime_nsec(entry);
      self[1].converter[0] = p_Var5;
      p_Var5 = (_func_wchar_t_archive_string_ptr_void_ptr_size_t_archive_string_conv_ptr *)
               archive_entry_ctime(entry);
      self[1].converter[1] = p_Var5;
      lVar6 = archive_entry_ctime_nsec(entry);
      *(long *)&self[1].nconverter = lVar6;
      iVar1 = __archive_rb_tree_insert_node((archive_rb_tree *)rbt,(archive_rb_node *)self);
      if (iVar1 == 0) {
        paVar7 = __archive_rb_tree_find_node((archive_rb_tree *)rbt,pcVar3);
        if (paVar7 != (archive_rb_node *)0x0) {
          *(int *)&paVar7[5].rb_info = (int)self[1].utftmp.length;
          paVar7[6].rb_nodes[0] = (archive_rb_node *)self[1].utftmp.buffer_length;
          paVar7[6].rb_nodes[1] = (archive_rb_node *)self[1].converter[0];
          paVar7[6].rb_info = (uintptr_t)self[1].converter[1];
          paVar7[7].rb_nodes[0] = *(archive_rb_node **)&self[1].nconverter;
        }
        archive_mstring_clean((archive_mstring *)&self->same);
        free(self);
      }
      else {
        (_a[2].sconv)->next = self;
        _a[2].sconv = (archive_string_conv *)&self->from_cp;
        _a[3].magic = _a[3].magic + 1;
        *(byte *)&_a[1].magic = (byte)_a[1].magic | 2;
      }
      return L'\0';
    }
    free(self);
    pcVar3 = "pathname is NULL";
  }
  archive_set_error(_a,0x16,pcVar3);
  return L'\xffffffe7';
}

Assistant:

int
archive_match_exclude_entry(struct archive *_a, int flag,
    struct archive_entry *entry)
{
	struct archive_match *a;
	int r;

	archive_check_magic(_a, ARCHIVE_MATCH_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_match_time_include_entry");
	a = (struct archive_match *)_a;

	if (entry == NULL) {
		archive_set_error(&(a->archive), EINVAL, "entry is NULL");
		return (ARCHIVE_FAILED);
	}
	r = validate_time_flag(_a, flag, "archive_match_exclude_entry");
	if (r != ARCHIVE_OK)
		return (r);
	return (add_entry(a, flag, entry));
}